

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseVfpuCondition(MipsParser *this,Parser *parser,int *result)

{
  char *__s;
  bool bVar1;
  Token *this_00;
  Identifier *this_01;
  size_t sVar2;
  long lVar3;
  char **ppcVar4;
  string_view other;
  
  this_00 = Parser::nextToken(parser);
  if (this_00->type == Identifier) {
    this_01 = Token::identifierValue(this_00);
    ppcVar4 = parseVfpuCondition::conditions;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      __s = *ppcVar4;
      sVar2 = strlen(__s);
      other._M_str = __s;
      other._M_len = sVar2;
      bVar1 = Identifier::operator==(this_01,other);
      if (bVar1) {
        *result = (int)lVar3;
        return true;
      }
      ppcVar4 = ppcVar4 + 1;
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuCondition(Parser& parser, int& result)
{
	static const char* conditions[] = {
		"fl", "eq", "lt", "le", "tr", "ne", "ge", "gt",
		"ez", "en", "ei", "es", "nz", "nn", "ni", "ns"
	};

	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const Identifier &stringValue = token.identifierValue();
	for (size_t i = 0; i <  std::size(conditions); i++)
	{
		if (stringValue == conditions[i])
		{
			result = (int)i;
			return true;
		}
	}

	return false;
}